

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int wally_map_find(wally_map *map_in,uchar *key,size_t key_len,size_t *written)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar2 = -2;
  if ((((map_in != (wally_map *)0x0) && (key != (uchar *)0x0)) && (key_len != 0)) &&
     (written != (size_t *)0x0)) {
    sVar1 = map_in->num_items;
    lVar4 = 8;
    for (sVar3 = 1; sVar3 - sVar1 != 1; sVar3 = sVar3 + 1) {
      if (*(size_t *)((long)&map_in->items->key + lVar4) == key_len) {
        iVar2 = bcmp(key,*(void **)((long)map_in->items + lVar4 + -8),key_len);
        if (iVar2 == 0) {
          *written = sVar3;
          break;
        }
      }
      lVar4 = lVar4 + 0x20;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int wally_map_find(const struct wally_map *map_in,
                   const unsigned char *key, size_t key_len,
                   size_t *written)
{
    size_t i;

    if (written)
        *written = 0;

    if (!map_in || !key || BYTES_INVALID(key, key_len) || !written)
        return WALLY_EINVAL;

    for (i = 0; i < map_in->num_items; ++i) {
        const struct wally_map_item *item = &map_in->items[i];

        if (key_len == item->key_len && memcmp(key, item->key, key_len) == 0) {
            *written = i + 1; /* Found */
            break;
        }
    }
    return WALLY_OK;
}